

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this,SVNInfo *svninfo)

{
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_log;
  string revs;
  OutputLogger err;
  LogParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined7 uStack_257;
  OutputLogger local_248;
  undefined1 local_208 [472];
  
  local_260 = 0;
  local_258 = '\0';
  local_268 = &local_258;
  iVar3 = atoi((svninfo->OldRevision)._M_dataplus._M_p);
  iVar4 = atoi((svninfo->NewRevision)._M_dataplus._M_p);
  if (iVar3 < iVar4) {
    std::operator+(&local_288,"-r",&svninfo->OldRevision);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
    ppcVar1 = &local_248.super_LineParser.Prefix;
    plVar6 = plVar5 + 2;
    if ((char **)*plVar5 == (char **)plVar6) {
      local_248.super_LineParser.Prefix = (char *)*plVar6;
      local_248.super_LineParser.Line._M_dataplus._M_p = (pointer)plVar5[3];
      local_248.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)ppcVar1;
    }
    else {
      local_248.super_LineParser.Prefix = (char *)*plVar6;
      local_248.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)*plVar5;
    }
    local_248.super_LineParser.Log = (ostream *)plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_248,(ulong)(svninfo->NewRevision)._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_208._16_8_ = *psVar7;
      local_208._24_8_ = plVar5[3];
      local_208._0_8_ = local_208 + 0x10;
    }
    else {
      local_208._16_8_ = *psVar7;
      local_208._0_8_ = (size_type *)*plVar5;
    }
    local_208._8_8_ = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_268,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if (local_248.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
      operator_delete(local_248.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_248.super_LineParser.Prefix + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_00306d2a;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "-r",&svninfo->NewRevision);
    std::__cxx11::string::operator=((string *)&local_268,(string *)local_208);
    local_288.field_2._M_allocated_capacity = local_208._16_8_;
    local_288._M_dataplus._M_p = (pointer)local_208._0_8_;
    if ((undefined1 *)local_208._0_8_ == local_208 + 0x10) goto LAB_00306d2a;
  }
  operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
LAB_00306d2a:
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  local_208._0_8_ = "log";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_288,(iterator)0x0,
             (char **)local_208);
  local_208._0_8_ = "--xml";
  if (local_288._M_string_length == local_288.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_288,
               (iterator)local_288._M_string_length,(char **)local_208);
  }
  else {
    *(char **)local_288._M_string_length = "--xml";
    local_288._M_string_length = local_288._M_string_length + 8;
  }
  local_208._0_8_ = "-v";
  if (local_288._M_string_length == local_288.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_288,
               (iterator)local_288._M_string_length,(char **)local_208);
  }
  else {
    *(char **)local_288._M_string_length = "-v";
    local_288._M_string_length = local_288._M_string_length + 8;
  }
  local_208._0_8_ = local_268;
  if (local_288._M_string_length == local_288.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_288,
               (iterator)local_288._M_string_length,(char **)local_208);
  }
  else {
    *(char **)local_288._M_string_length = local_268;
    local_288._M_string_length = local_288._M_string_length + 8;
  }
  local_208._0_8_ = (svninfo->LocalPath)._M_dataplus._M_p;
  if (local_288._M_string_length == local_288.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_288,
               (iterator)local_288._M_string_length,(char **)local_208);
  }
  else {
    *(undefined8 *)local_288._M_string_length = local_208._0_8_;
    local_288._M_string_length = local_288._M_string_length + 8;
  }
  LogParser::LogParser((LogParser *)local_208,this,"log-out> ",svninfo);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_248,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
  bVar2 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_288,
                        (OutputParser *)local_208,(OutputParser *)&local_248);
  local_248.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00789028;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.super_LineParser.Line._M_dataplus._M_p !=
      &local_248.super_LineParser.Line.field_2) {
    operator_delete(local_248.super_LineParser.Line._M_dataplus._M_p,
                    local_248.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  LogParser::~LogParser((LogParser *)local_208);
  if (local_288._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_288._M_dataplus._M_p,
                    local_288.field_2._M_allocated_capacity - (long)local_288._M_dataplus._M_p);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::LoadRevisions(SVNInfo& svninfo)
{
  // We are interested in every revision included in the update.
  std::string revs;
  if (atoi(svninfo.OldRevision.c_str()) < atoi(svninfo.NewRevision.c_str())) {
    revs = "-r" + svninfo.OldRevision + ":" + svninfo.NewRevision;
  } else {
    revs = "-r" + svninfo.NewRevision;
  }

  // Run "svn log" to get all global revisions of interest.
  std::vector<const char*> svn_log;
  svn_log.push_back("log");
  svn_log.push_back("--xml");
  svn_log.push_back("-v");
  svn_log.push_back(revs.c_str());
  svn_log.push_back(svninfo.LocalPath.c_str());
  LogParser out(this, "log-out> ", svninfo);
  OutputLogger err(this->Log, "log-err> ");
  return this->RunSVNCommand(svn_log, &out, &err);
}